

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastMinus(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vRes)

{
  int iVar1;
  int *piVar2;
  int local_38;
  int local_34;
  int invert;
  int i;
  int *pRes;
  Vec_Int_t *vRes_local;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  piVar2 = Wlc_VecCopy(vRes,pNum,nNum);
  local_38 = 0;
  for (local_34 = 0; local_34 < nNum; local_34 = local_34 + 1) {
    iVar1 = Abc_LitNot(piVar2[local_34]);
    iVar1 = Gia_ManHashMux(pNew,local_38,iVar1,piVar2[local_34]);
    piVar2[local_34] = iVar1;
    local_38 = Gia_ManHashOr(pNew,local_38,pNum[local_34]);
  }
  return;
}

Assistant:

void Wlc_BlastMinus( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vRes )
{
    int * pRes  = Wlc_VecCopy( vRes, pNum, nNum );
    int i, invert = 0;
    for ( i = 0; i < nNum; i++ )
    {
        pRes[i] = Gia_ManHashMux( pNew, invert, Abc_LitNot(pRes[i]), pRes[i] );
        invert = Gia_ManHashOr( pNew, invert, pNum[i] );    
    }
}